

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O1

void sf::priv::ensureExtensionsInit(Display *display,int screen)

{
  if (ensureExtensionsInit(_XDisplay*,int)::initialized != '\0') {
    return;
  }
  ensureExtensionsInit(_XDisplay*,int)::initialized = 1;
  sfglx_LoadFunctions(display,screen);
  return;
}

Assistant:

void ensureExtensionsInit(::Display* display, int screen)
{
    static bool initialized = false;
    if (!initialized)
    {
        initialized = true;

        // We don't check the return value since the extension
        // flags are cleared even if loading fails
        sfglx_LoadFunctions(display, screen);
    }
}